

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-signals.c
# Opt level: O0

void handle_signal_suspend(int sig)

{
  int iVar1;
  int *piVar2;
  int save_errno;
  int sig_local;
  
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  (*signal_aux)(sig,(Signal_Handler_t)&DAT_00000001);
  Term_fresh();
  Term_xtra(L'\v',L'\0');
  kill(0,0x13);
  Term_xtra(L'\v',L'\x01');
  Term_redraw();
  Term_fresh();
  (*signal_aux)(sig,handle_signal_suspend);
  piVar2 = __errno_location();
  *piVar2 = iVar1;
  return;
}

Assistant:

static void handle_signal_suspend(int sig)
{
	/* Protect errno from library calls in signal handler */
	int save_errno = errno;

	/* Disable handler */
	(void)(*signal_aux)(sig, SIG_IGN);

#ifdef SIGSTOP

	/* Flush output */
	Term_fresh();

	/* Suspend the "Term" */
	Term_xtra(TERM_XTRA_ALIVE, 0);

	/* Suspend ourself */
	(void)kill(0, SIGSTOP);

	/* Resume the "Term" */
	Term_xtra(TERM_XTRA_ALIVE, 1);

	/* Redraw the term */
	Term_redraw();

	/* Flush the term */
	Term_fresh();

#endif

	/* Restore handler */
	(void)(*signal_aux)(sig, handle_signal_suspend);

	/* Restore errno */
	errno = save_errno;
}